

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse41_128_64.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_table_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  long *plVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  parasail_result_t *ppVar11;
  __m128i *palVar12;
  __m128i *ptr;
  __m128i *ptr_00;
  int64_t *ptr_01;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  uint uVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  bool bVar40;
  longlong lVar41;
  ulong uVar42;
  ulong uVar44;
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  long lVar49;
  long lVar51;
  undefined1 auVar50 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  __m128i_64_t B;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int64_t iVar57;
  long lVar58;
  undefined1 auVar59 [16];
  long lVar61;
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  __m128i_64_t e;
  __m128i_64_t h;
  int local_144;
  ulong local_130;
  __m128i *local_f0;
  longlong local_58 [5];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_striped_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sg_flags_table_striped_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_striped_profile_sse41_128_64_cold_6();
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          parasail_sg_flags_table_striped_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_striped_profile_sse41_128_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_table_striped_profile_sse41_128_64_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_table_striped_profile_sse41_128_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_table_striped_profile_sse41_128_64_cold_1();
        }
        else {
          iVar8 = uVar2 - 1;
          uVar27 = (ulong)uVar2 + 1;
          uVar37 = uVar27 >> 1;
          uVar36 = (uint)uVar37;
          iVar9 = iVar8 / (int)uVar36;
          uVar21 = iVar8 % (int)uVar36;
          uVar17 = (ulong)(uint)open;
          iVar30 = -open;
          iVar16 = ppVar4->min;
          uVar33 = 0x8000000000000000 - (long)iVar16;
          if (iVar16 != iVar30 && SBORROW4(iVar16,iVar30) == iVar16 + open < 0) {
            uVar33 = uVar17 | 0x8000000000000000;
          }
          iVar16 = ppVar4->max;
          ppVar11 = parasail_result_new_table1((uint)uVar27 & 0x7ffffffe,s2Len);
          if (ppVar11 != (parasail_result_t *)0x0) {
            ppVar11->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar11->flag | 0x2820802;
            palVar12 = parasail_memalign___m128i(0x10,uVar37);
            ptr = parasail_memalign___m128i(0x10,uVar37);
            ptr_00 = parasail_memalign___m128i(0x10,uVar37);
            ptr_01 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
            if ((ptr_01 != (int64_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                (ptr != (__m128i *)0x0 && palVar12 != (__m128i *)0x0)) {
              iVar14 = s2Len + -1;
              iVar15 = 1 - iVar9;
              uVar42 = (ulong)(uint)gap;
              local_130 = uVar33 + 1;
              lVar34 = 0x7ffffffffffffffe - (long)iVar16;
              auVar45._8_4_ = (int)local_130;
              auVar45._0_8_ = local_130;
              auVar45._12_4_ = (int)(local_130 >> 0x20);
              auVar50._8_4_ = (int)lVar34;
              auVar50._0_8_ = lVar34;
              auVar50._12_4_ = (int)((ulong)lVar34 >> 0x20);
              auVar47._0_8_ = (long)iVar15;
              auVar47._8_4_ = iVar15;
              auVar47._12_4_ = iVar15 >> 0x1f;
              lVar22 = (long)iVar30;
              uVar26 = 0;
              do {
                lVar28 = 0;
                lVar18 = lVar22;
                do {
                  lVar29 = lVar18;
                  if (s1_beg != 0) {
                    lVar29 = 0;
                  }
                  local_58[lVar28 + 2] = lVar29;
                  local_58[lVar28] = lVar29 - uVar17;
                  lVar28 = lVar28 + 1;
                  lVar18 = lVar18 - uVar37 * (uint)gap;
                } while (lVar28 == 1);
                palVar12[uVar26][0] = local_58[2];
                palVar12[uVar26][1] = local_58[3];
                ptr_00[uVar26][0] = local_58[0];
                ptr_00[uVar26][1] = local_58[1];
                uVar26 = uVar26 + 1;
                lVar22 = lVar22 - (ulong)(uint)gap;
              } while (uVar26 != uVar37);
              *ptr_01 = 0;
              uVar26 = 1;
              iVar16 = iVar30;
              do {
                iVar15 = 0;
                if (s2_beg == 0) {
                  iVar15 = iVar16;
                }
                ptr_01[uVar26] = (long)iVar15;
                uVar26 = uVar26 + 1;
                iVar16 = iVar16 - gap;
              } while (s2Len + 1 != uVar26);
              uVar26 = 1;
              if (1 < s2Len) {
                uVar26 = (ulong)(uint)s2Len;
              }
              lVar22 = uVar37 * (uint)s2Len * 4;
              lVar28 = (ulong)(uint)s2Len * 4;
              lVar18 = (ulong)(uVar36 + (uVar36 == 0)) << 4;
              lVar29 = 0;
              auVar48._0_8_ = -(ulong)(auVar47._0_8_ == 1);
              auVar48._8_8_ = -(ulong)(auVar47._8_8_ == 0);
              uVar31 = 0;
              auVar52 = auVar45;
              auVar53 = auVar45;
              local_144 = iVar14;
              do {
                local_f0 = ptr;
                ptr = palVar12;
                palVar12 = ptr + (uVar36 - 1);
                auVar59._8_4_ = (int)(*palVar12)[0];
                auVar59._0_8_ = (*palVar12)[0];
                auVar59._12_4_ = *(undefined4 *)((long)*palVar12 + 4);
                iVar16 = ppVar4->mapper[(byte)s2[uVar31]];
                iVar57 = ptr_01[uVar31];
                lVar61 = auVar59._8_8_;
                lVar24 = 0;
                lVar13 = lVar29;
                auVar54 = auVar45;
                do {
                  plVar1 = (long *)((long)pvVar3 + lVar24 + (long)iVar16 * (long)(int)uVar36 * 0x10)
                  ;
                  lVar58 = iVar57 + *plVar1;
                  lVar61 = lVar61 + plVar1[1];
                  lVar49 = *(long *)((long)*ptr_00 + lVar24);
                  if (lVar58 <= lVar49) {
                    lVar58 = lVar49;
                  }
                  lVar51 = *(long *)((long)*ptr_00 + lVar24 + 8);
                  if (lVar61 <= lVar51) {
                    lVar61 = lVar51;
                  }
                  lVar23 = auVar54._0_8_;
                  if (lVar58 <= lVar23) {
                    lVar58 = lVar23;
                  }
                  lVar39 = auVar54._8_8_;
                  if (lVar61 <= lVar39) {
                    lVar61 = lVar39;
                  }
                  lVar19 = auVar53._0_8_;
                  if (auVar53._0_8_ <= lVar58) {
                    lVar19 = lVar58;
                  }
                  lVar25 = auVar53._8_8_;
                  if (auVar53._8_8_ <= lVar61) {
                    lVar25 = lVar61;
                  }
                  lVar38 = auVar50._0_8_;
                  if (lVar58 <= auVar50._0_8_) {
                    lVar38 = lVar58;
                  }
                  lVar35 = auVar50._8_8_;
                  if (lVar61 <= auVar50._8_8_) {
                    lVar35 = lVar61;
                  }
                  if (lVar49 <= lVar38) {
                    lVar38 = lVar49;
                  }
                  if (lVar51 <= lVar35) {
                    lVar35 = lVar51;
                  }
                  if (lVar23 <= lVar38) {
                    lVar38 = lVar23;
                  }
                  plVar1 = (long *)((long)*ptr_00 + lVar24);
                  lVar49 = *plVar1;
                  lVar51 = plVar1[1];
                  plVar1 = (long *)((long)*local_f0 + lVar24);
                  *plVar1 = lVar58;
                  plVar1[1] = lVar61;
                  if (lVar39 <= lVar35) {
                    lVar35 = lVar39;
                  }
                  piVar5 = ((ppVar11->field_4).rowcols)->score_row;
                  *(int *)((long)piVar5 + lVar13) = (int)lVar58;
                  *(int *)((long)piVar5 + lVar22 + lVar13) = (int)lVar61;
                  lVar58 = lVar58 - uVar17;
                  lVar61 = lVar61 - (ulong)(uint)open;
                  lVar49 = lVar49 - uVar42;
                  uVar44 = (ulong)(uint)gap;
                  lVar51 = lVar51 - uVar44;
                  if (lVar49 <= lVar58) {
                    lVar49 = lVar58;
                  }
                  if (lVar51 <= lVar61) {
                    lVar51 = lVar61;
                  }
                  if (lVar58 < (long)(lVar23 - uVar42)) {
                    lVar58 = lVar23 - uVar42;
                  }
                  if (lVar61 < (long)(lVar39 - uVar44)) {
                    lVar61 = lVar39 - uVar44;
                  }
                  auVar53._8_8_ = lVar25;
                  auVar53._0_8_ = lVar19;
                  auVar50._8_8_ = lVar35;
                  auVar50._0_8_ = lVar38;
                  plVar1 = (long *)((long)*ptr_00 + lVar24);
                  *plVar1 = lVar49;
                  plVar1[1] = lVar51;
                  auVar54._8_8_ = lVar61;
                  auVar54._0_8_ = lVar58;
                  plVar1 = (long *)((long)*ptr + lVar24);
                  iVar57 = *plVar1;
                  lVar61 = plVar1[1];
                  lVar24 = lVar24 + 0x10;
                  lVar13 = lVar13 + lVar28;
                } while (lVar18 != lVar24);
                iVar16 = 0;
                do {
                  lVar61 = (long)iVar30;
                  if (s2_beg == 0) {
                    lVar61 = ptr_01[uVar31 + 1] - uVar17;
                  }
                  auVar55._0_8_ = auVar54._0_8_;
                  auVar55._8_4_ = auVar54._0_4_;
                  auVar55._12_4_ = auVar54._4_4_;
                  auVar54._8_8_ = auVar55._8_8_;
                  auVar54._0_8_ = lVar61;
                  bVar40 = true;
                  uVar32 = 1;
                  lVar13 = 0;
                  lVar61 = lVar29;
                  do {
                    lVar51 = auVar54._0_8_;
                    lVar24 = *(long *)((long)*local_f0 + lVar13);
                    lVar49 = *(long *)((long)*local_f0 + lVar13 + 8);
                    lVar58 = lVar51;
                    if (lVar51 < lVar24) {
                      lVar58 = lVar24;
                    }
                    lVar23 = auVar54._8_8_;
                    lVar24 = lVar23;
                    if (lVar23 < lVar49) {
                      lVar24 = lVar49;
                    }
                    lVar49 = auVar50._0_8_;
                    if (lVar58 <= auVar50._0_8_) {
                      lVar49 = lVar58;
                    }
                    plVar1 = (long *)((long)*local_f0 + lVar13);
                    *plVar1 = lVar58;
                    plVar1[1] = lVar24;
                    lVar39 = auVar50._8_8_;
                    if (lVar24 <= auVar50._8_8_) {
                      lVar39 = lVar24;
                    }
                    lVar19 = auVar53._0_8_;
                    if (auVar53._0_8_ <= lVar58) {
                      lVar19 = lVar58;
                    }
                    auVar50._8_8_ = lVar39;
                    auVar50._0_8_ = lVar49;
                    lVar25 = auVar53._8_8_;
                    if (auVar53._8_8_ <= lVar24) {
                      lVar25 = lVar24;
                    }
                    auVar53._8_8_ = lVar25;
                    auVar53._0_8_ = lVar19;
                    piVar5 = ((ppVar11->field_4).rowcols)->score_row;
                    *(int *)((long)piVar5 + lVar61) = (int)lVar58;
                    *(int *)((long)piVar5 + lVar22 + lVar61) = (int)lVar24;
                    auVar54._0_8_ = lVar51 - uVar42;
                    auVar54._8_8_ = lVar23 - uVar44;
                    auVar62._0_8_ = -(ulong)((long)(lVar58 - uVar17) < auVar54._0_8_);
                    auVar62._8_8_ = -(ulong)((long)(lVar24 - (ulong)(uint)open) < auVar54._8_8_);
                    uVar10 = movmskpd((int)lVar24,auVar62);
                    uVar20 = -(ulong)(byte)((byte)uVar10 >> 1);
                    auVar60._8_8_ = uVar20;
                    auVar60._0_8_ = -(ulong)(uVar10 & 1);
                    if ((((((((((((((((auVar60 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar60 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar60 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar60 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar60 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar60 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar60 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar60 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (uVar20 >> 7 & 1) == 0) && (uVar20 >> 0xf & 1) == 0) &&
                            (uVar20 >> 0x17 & 1) == 0) && (uVar20 >> 0x1f & 1) == 0) &&
                          (uVar20 >> 0x27 & 1) == 0) && (uVar20 >> 0x2f & 1) == 0) &&
                        (uVar20 >> 0x37 & 1) == 0) && -1 < (long)uVar20) break;
                    bVar40 = uVar32 < uVar37;
                    lVar13 = lVar13 + 0x10;
                    lVar61 = lVar61 + lVar28;
                    uVar32 = uVar32 + 1;
                  } while (lVar18 != lVar13);
                } while ((!bVar40) && (bVar40 = iVar16 == 0, iVar16 = iVar16 + 1, bVar40));
                lVar13 = auVar52._0_8_;
                lVar61 = local_f0[uVar21][0];
                uVar20 = auVar52._8_8_;
                uVar44 = local_f0[uVar21][1];
                uVar32 = uVar20;
                if ((long)uVar20 < (long)uVar44) {
                  uVar32 = uVar44;
                }
                lVar24 = lVar13;
                if (lVar13 < lVar61) {
                  lVar24 = lVar61;
                }
                auVar56._8_8_ = -(ulong)((long)uVar20 < (long)uVar44);
                auVar56._0_8_ = -(ulong)(lVar13 < lVar61);
                auVar56 = auVar56 & auVar48;
                auVar52._8_8_ = uVar32;
                auVar52._0_8_ = lVar24;
                if ((((((((((((((((auVar56 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar56 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar56 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar56 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar56 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar56 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar56 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar56 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar56 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar56 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar56 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar56 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar56 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar56 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar56 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar56[0xf] < '\0') {
                  local_144 = (int)uVar31;
                }
                uVar31 = uVar31 + 1;
                lVar29 = lVar29 + 4;
                palVar12 = local_f0;
                if (uVar31 == uVar26) {
                  if ((s2_end != 0) && (local_130 = uVar32, iVar9 < 1)) {
                    do {
                      local_130 = auVar52._0_8_;
                      auVar6._8_8_ = 0;
                      auVar6._0_8_ = local_130;
                      auVar52 = auVar6 << 0x40;
                    } while (iVar9 < 0);
                  }
                  iVar16 = iVar8;
                  if ((s1_end != 0) && ((uVar27 & 0x7ffffffe) != 0)) {
                    uVar27 = 0;
                    do {
                      uVar10 = 0;
                      if ((uVar27 & 1) != 0) {
                        uVar10 = uVar36;
                      }
                      iVar30 = uVar10 + ((uint)(uVar27 >> 1) & 0x7fffffff);
                      iVar15 = iVar16;
                      iVar7 = local_144;
                      uVar17 = local_130;
                      if ((iVar30 < (int)uVar2) &&
                         (uVar37 = (*local_f0)[uVar27], iVar15 = iVar30, iVar7 = iVar14,
                         uVar17 = uVar37, (long)uVar37 <= (long)local_130)) {
                        if (iVar16 <= iVar30) {
                          iVar30 = iVar16;
                        }
                        if (local_144 != iVar14) {
                          iVar30 = iVar16;
                        }
                        iVar15 = iVar16;
                        iVar7 = local_144;
                        uVar17 = local_130;
                        if (uVar37 == local_130) {
                          iVar15 = iVar30;
                        }
                      }
                      local_130 = uVar17;
                      local_144 = iVar7;
                      iVar16 = iVar15;
                      uVar27 = uVar27 + 1;
                    } while ((uVar36 & 0x3fffffff) * 2 != (int)uVar27);
                  }
                  if (s2_end == 0 && s1_end == 0) {
                    lVar41 = local_f0[uVar21][0];
                    local_130._0_4_ = (int)local_f0[uVar21][1];
                    iVar16 = iVar8;
                    local_144 = iVar14;
                    if (iVar9 < 1) {
                      do {
                        local_130._0_4_ = (int)lVar41;
                        lVar41 = 0;
                      } while (iVar9 < 0);
                    }
                  }
                  auVar43._8_8_ = -(ulong)(lVar39 <= (long)uVar33);
                  auVar43._0_8_ = -(ulong)(lVar49 <= (long)uVar33);
                  auVar46._8_8_ = -(ulong)(lVar34 < lVar25);
                  auVar46._0_8_ = -(ulong)(lVar34 < lVar19);
                  auVar46 = auVar46 | auVar43;
                  if ((((((((((((((((auVar46 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar46 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar46 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar46 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar46 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar46 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar46 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar46 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar46 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar46 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar46 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar46 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar46 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar46[0xf] < '\0') {
                    *(byte *)&ppVar11->flag = (byte)ppVar11->flag | 0x40;
                    local_130._0_4_ = 0;
                    local_144 = 0;
                    iVar16 = 0;
                  }
                  ppVar11->score = (int)local_130;
                  ppVar11->end_query = iVar16;
                  ppVar11->end_ref = local_144;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr);
                  parasail_free(local_f0);
                  return ppVar11;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi64(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi64_rpl(vH, vMaxH));
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}